

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_SelectCoinsBnB_empty_with_asset_Test::
CoinSelection_SelectCoins_SelectCoinsBnB_empty_with_asset_Test
          (CoinSelection_SelectCoins_SelectCoinsBnB_empty_with_asset_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test =
       (_func_int **)&PTR__CoinSelection_SelectCoins_SelectCoinsBnB_empty_with_asset_Test_003b6878;
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_SelectCoinsBnB_empty_with_asset)
{
  CoinSelection coin_select(true);
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 114040000;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset,
        nullptr, &(*ite));
    ++ite;
  }

  CoinSelectionOption option_params;
  option_params.InitializeConfidentialTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(1);
  option_params.SetFeeAsset(exp_dummy_asset_a);

  std::vector<Utxo> select_utxos;
  EXPECT_NO_THROW((select_utxos = coin_select.SelectCoins(map_target_amount, utxos,
      exp_filter, option_params, tx_fee, &map_select_value, &fee, &map_searched_bnb)));
  EXPECT_EQ(select_utxos.size(), 3);
  if (select_utxos.size() == 3) {
    EXPECT_EQ(select_utxos[0].amount, static_cast<int64_t>(61062500));
    EXPECT_EQ(select_utxos[1].amount, static_cast<int64_t>(39062500));
    EXPECT_EQ(select_utxos[2].amount, static_cast<int64_t>(14938590));
  }
  EXPECT_EQ(map_select_value.size(), 1);
  if (map_select_value.size() == 1) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 115063590);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 276);
  EXPECT_EQ(map_searched_bnb.size(), 1);
  if (map_searched_bnb.size() == 1) {
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
  }
}